

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

QByteArray * __thiscall
QResource::uncompressedData(QByteArray *__return_storage_ptr__,QResource *this)

{
  QResourcePrivate *this_00;
  Data *pDVar1;
  uchar *puVar2;
  qint64 size;
  char *__file;
  __off_t __length;
  QResourcePrivate *d;
  
  this_00 = (this->d_ptr).d;
  QResourcePrivate::ensureInitialized(this_00);
  size = QResourcePrivate::uncompressedSize(this_00);
  if (size < 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if (this_00->compressionAlgo == '\0') {
    puVar2 = this_00->data;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)puVar2;
    (__return_storage_ptr__->d).size = size;
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(__return_storage_ptr__,size,Uninitialized);
    pDVar1 = (__return_storage_ptr__->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
    }
    __file = (char *)QResourcePrivate::decompress(this_00,(__return_storage_ptr__->d).ptr,size);
    if ((long)__file < 0) {
      QByteArray::clear(__return_storage_ptr__);
    }
    else {
      QByteArray::truncate(__return_storage_ptr__,__file,__length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QResource::uncompressedData() const
{
    Q_D(const QResource);
    qint64 n = uncompressedSize();
    if (n < 0)
        return QByteArray();
    if (n > std::numeric_limits<QByteArray::size_type>::max()) {
        qWarning("QResource: compressed content does not fit into a QByteArray; use QFile instead");
        return QByteArray();
    }
    if (d->compressionAlgo == NoCompression)
        return QByteArray::fromRawData(reinterpret_cast<const char *>(d->data), n);

    // decompress
    QByteArray result(n, Qt::Uninitialized);
    n = d->decompress(result.data(), n);
    if (n < 0)
        result.clear();
    else
        result.truncate(n);
    return result;
}